

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSFunctionDef *
js_new_function_def(JSContext *ctx,JSFunctionDef *parent,BOOL is_eval,BOOL is_func_expr,
                   char *filename,int line_num)

{
  list_head *plVar1;
  JSAtom JVar2;
  JSFunctionDef *pJVar3;
  size_t len;
  
  pJVar3 = (JSFunctionDef *)js_mallocz(ctx,0x220);
  if (pJVar3 == (JSFunctionDef *)0x0) {
    pJVar3 = (JSFunctionDef *)0x0;
  }
  else {
    pJVar3->ctx = ctx;
    (pJVar3->child_list).prev = &pJVar3->child_list;
    (pJVar3->child_list).next = &pJVar3->child_list;
    pJVar3->parent = parent;
    pJVar3->parent_cpool_idx = -1;
    if (parent != (JSFunctionDef *)0x0) {
      plVar1 = (parent->child_list).prev;
      plVar1->next = &pJVar3->link;
      (pJVar3->link).prev = plVar1;
      (pJVar3->link).next = &parent->child_list;
      (parent->child_list).prev = &pJVar3->link;
      pJVar3->js_mode = parent->js_mode;
      pJVar3->parent_scope_level = parent->scope_level;
    }
    pJVar3->is_eval = is_eval;
    pJVar3->is_func_expr = is_func_expr;
    dbuf_init2(&pJVar3->byte_code,ctx->rt,js_realloc_rt);
    pJVar3->last_opcode_pos = -1;
    pJVar3->func_name = 0;
    pJVar3->var_object_idx = -1;
    pJVar3->arg_var_object_idx = -1;
    pJVar3->arguments_var_idx = -1;
    pJVar3->arguments_arg_idx = -1;
    pJVar3->func_var_idx = -1;
    pJVar3->eval_ret_idx = -1;
    pJVar3->this_var_idx = -1;
    pJVar3->new_target_var_idx = -1;
    pJVar3->this_active_func_var_idx = -1;
    pJVar3->home_object_var_idx = -1;
    pJVar3->scopes = pJVar3->def_scope_array;
    pJVar3->def_scope_array[0].parent = -1;
    pJVar3->def_scope_array[0].first = -1;
    pJVar3->scope_level = 0;
    pJVar3->scope_first = -1;
    pJVar3->scope_size = 4;
    pJVar3->scope_count = 1;
    pJVar3->body_scope = -1;
    len = strlen(filename);
    JVar2 = JS_NewAtomLen(ctx,filename,len);
    pJVar3->filename = JVar2;
    pJVar3->line_num = line_num;
    dbuf_init2(&pJVar3->pc2line,ctx->rt,js_realloc_rt);
    pJVar3->last_opcode_line_num = line_num;
  }
  return pJVar3;
}

Assistant:

static JSFunctionDef *js_new_function_def(JSContext *ctx,
                                          JSFunctionDef *parent,
                                          BOOL is_eval,
                                          BOOL is_func_expr,
                                          const char *filename, int line_num)
{
    JSFunctionDef *fd;

    fd = js_mallocz(ctx, sizeof(*fd));
    if (!fd)
        return NULL;

    fd->ctx = ctx;
    init_list_head(&fd->child_list);

    /* insert in parent list */
    fd->parent = parent;
    fd->parent_cpool_idx = -1;
    if (parent) {
        list_add_tail(&fd->link, &parent->child_list);
        fd->js_mode = parent->js_mode;
        fd->parent_scope_level = parent->scope_level;
    }

    fd->is_eval = is_eval;
    fd->is_func_expr = is_func_expr;
    js_dbuf_init(ctx, &fd->byte_code);
    fd->last_opcode_pos = -1;
    fd->func_name = JS_ATOM_NULL;
    fd->var_object_idx = -1;
    fd->arg_var_object_idx = -1;
    fd->arguments_var_idx = -1;
    fd->arguments_arg_idx = -1;
    fd->func_var_idx = -1;
    fd->eval_ret_idx = -1;
    fd->this_var_idx = -1;
    fd->new_target_var_idx = -1;
    fd->this_active_func_var_idx = -1;
    fd->home_object_var_idx = -1;

    /* XXX: should distinguish arg, var and var object and body scopes */
    fd->scopes = fd->def_scope_array;
    fd->scope_size = countof(fd->def_scope_array);
    fd->scope_count = 1;
    fd->scopes[0].first = -1;
    fd->scopes[0].parent = -1;
    fd->scope_level = 0;  /* 0: var/arg scope */
    fd->scope_first = -1;
    fd->body_scope = -1;

    fd->filename = JS_NewAtom(ctx, filename);
    fd->line_num = line_num;

    js_dbuf_init(ctx, &fd->pc2line);
    //fd->pc2line_last_line_num = line_num;
    //fd->pc2line_last_pc = 0;
    fd->last_opcode_line_num = line_num;

    return fd;
}